

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O0

void __thiscall tcu::anon_unknown_4::Test::testULP(Test *this,double arg,double ref)

{
  ostream *poVar1;
  FloatFormat *this_00;
  double result;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream oss;
  double ref_local;
  double arg_local;
  Test *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"ulp(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,arg);
  std::operator<<(poVar1,")");
  std::__cxx11::ostringstream::str();
  this_00 = de::details::UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>::
            operator->((UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_> *)this);
  result = FloatFormat::ulp(this_00,arg,1.0);
  check(this,&local_1c8,result,ref);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void Test::testULP (double arg, double ref) const
{
	ostringstream	oss;

	oss << "ulp(" << arg << ")";
	check(oss.str(), m_fmt->ulp(arg), ref);
}